

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

bool __thiscall
testing::internal::QuantifierMatcherImpl<const_nsh_cmd_(&)[32]>::MatchAndExplainImpl
          (QuantifierMatcherImpl<const_nsh_cmd_(&)[32]> *this,bool all_elements_should_match,
          nsh_cmd (*container) [32],MatchResultListener *listener)

{
  ostream *poVar1;
  nsh_cmd *pnVar2;
  bool bVar3;
  byte bVar4;
  MatchResultListener *this_00;
  long lVar5;
  StringMatchResultListener inner_listener;
  long *local_1f0;
  long local_1e8;
  long local_1e0 [2];
  nsh_cmd (*local_1d0) [32];
  MatchResultListener local_1c8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  lVar5 = 0;
  local_1d0 = container;
  do {
    pnVar2 = *local_1d0;
    local_1c8.stream_ = local_1a8;
    local_1c8._vptr_MatchResultListener = (_func_int **)&PTR__StringMatchResultListener_0016c348;
    std::__cxx11::stringstream::stringstream(local_1b8);
    bVar3 = MatcherBase<const_nsh_cmd_&>::MatchAndExplain
                      (&(this->inner_matcher_).super_MatcherBase<const_nsh_cmd_&>,
                       (nsh_cmd *)(pnVar2->name + lVar5 + -8),&local_1c8);
    if (bVar3 != all_elements_should_match) {
      this_00 = MatchResultListener::operator<<(listener,(char (*) [16])"whose element #");
      if (this_00->stream_ != (ostream *)0x0) {
        std::ostream::_M_insert<unsigned_long>((ulong)this_00->stream_);
      }
      local_1f0 = (long *)0x14e5e0;
      if (bVar3) {
        local_1f0 = (long *)0x14efaf;
      }
      MatchResultListener::operator<<(this_00,(char **)&local_1f0);
      std::__cxx11::stringbuf::str();
      poVar1 = listener->stream_;
      if ((poVar1 != (ostream *)0x0) && (local_1e8 != 0)) {
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_1f0,local_1e8);
      }
      if (local_1f0 != local_1e0) {
        operator_delete(local_1f0,local_1e0[0] + 1);
      }
    }
    local_1c8._vptr_MatchResultListener = (_func_int **)&PTR__StringMatchResultListener_0016c348;
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base(local_138);
    bVar4 = !all_elements_should_match;
  } while ((bVar3 == all_elements_should_match) &&
          (lVar5 = lVar5 + 0x18, bVar4 = all_elements_should_match, lVar5 != 0x300));
  return (bool)(bVar4 & 1);
}

Assistant:

bool MatchAndExplainImpl(bool all_elements_should_match, Container container,
                           MatchResultListener* listener) const {
    StlContainerReference stl_container = View::ConstReference(container);
    size_t i = 0;
    for (auto it = stl_container.begin(); it != stl_container.end();
         ++it, ++i) {
      StringMatchResultListener inner_listener;
      const bool matches = inner_matcher_.MatchAndExplain(*it, &inner_listener);

      if (matches != all_elements_should_match) {
        *listener << "whose element #" << i
                  << (matches ? " matches" : " doesn't match");
        PrintIfNotEmpty(inner_listener.str(), listener->stream());
        return !all_elements_should_match;
      }
    }
    return all_elements_should_match;
  }